

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void stbtt__h_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,uint kernel_width)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uchar buffer [8];
  byte local_50 [8];
  ulong local_48;
  int local_3c;
  long local_38;
  ulong uVar6;
  
  local_50[0] = 0;
  local_50[1] = 0;
  local_50[2] = 0;
  local_50[3] = 0;
  local_50[4] = 0;
  local_50[5] = 0;
  local_50[6] = 0;
  local_50[7] = 0;
  if (0 < h) {
    local_48 = (ulong)(w - kernel_width);
    local_38 = (long)stride_in_bytes;
    uVar5 = (w - kernel_width) + 1;
    uVar6 = (ulong)uVar5;
    iVar9 = 0;
    local_3c = h;
    do {
      memset(local_50,0,(ulong)kernel_width);
      uVar3 = uVar5;
      switch(kernel_width) {
      case 2:
        if ((int)local_48 < 0) {
LAB_001117e6:
          uVar4 = 0;
          uVar3 = 0;
        }
        else {
          uVar8 = 0;
          uVar4 = 0;
          do {
            bVar1 = pixels[uVar8];
            bVar2 = local_50[(uint)uVar8 & 7];
            local_50[(uint)uVar8 + 2 & 7] = bVar1;
            uVar4 = uVar4 + ((uint)bVar1 - (uint)bVar2);
            pixels[uVar8] = (uchar)(uVar4 >> 1);
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
        break;
      case 3:
        if ((int)local_48 < 0) goto LAB_001117e6;
        uVar8 = 0;
        uVar4 = 0;
        do {
          bVar1 = pixels[uVar8];
          bVar2 = local_50[(uint)uVar8 & 7];
          local_50[(uint)uVar8 + 3 & 7] = bVar1;
          uVar4 = uVar4 + ((uint)bVar1 - (uint)bVar2);
          pixels[uVar8] = (uchar)(uVar4 / 3);
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        break;
      case 4:
        if ((int)local_48 < 0) goto LAB_001117e6;
        uVar8 = 0;
        uVar4 = 0;
        do {
          bVar1 = pixels[uVar8];
          uVar7 = (ulong)((uint)uVar8 & 7);
          local_50[uVar7 ^ 4] = bVar1;
          uVar4 = uVar4 + ((uint)bVar1 - (uint)local_50[uVar7]);
          pixels[uVar8] = (uchar)(uVar4 >> 2);
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        break;
      case 5:
        if ((int)local_48 < 0) goto LAB_001117e6;
        uVar8 = 0;
        uVar4 = 0;
        do {
          bVar1 = pixels[uVar8];
          bVar2 = local_50[(uint)uVar8 & 7];
          local_50[(uint)uVar8 + 5 & 7] = bVar1;
          uVar4 = uVar4 + ((uint)bVar1 - (uint)bVar2);
          pixels[uVar8] = (uchar)(uVar4 / 5);
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        break;
      default:
        if ((int)local_48 < 0) {
          uVar4 = 0;
          uVar3 = 0;
        }
        else {
          uVar8 = 0;
          uVar4 = 0;
          do {
            bVar1 = pixels[uVar8];
            bVar2 = local_50[(uint)uVar8 & 7];
            local_50[kernel_width + (uint)uVar8 & 7] = bVar1;
            uVar4 = uVar4 + ((uint)bVar1 - (uint)bVar2);
            pixels[uVar8] = (uchar)(uVar4 / kernel_width);
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
      }
      if ((int)uVar3 < w) {
        uVar8 = (ulong)uVar3;
        do {
          uVar4 = uVar4 - local_50[(uint)uVar8 & 7];
          pixels[uVar8] = (uchar)(uVar4 / kernel_width);
          uVar8 = uVar8 + 1;
        } while ((int)uVar8 < w);
      }
      pixels = pixels + local_38;
      iVar9 = iVar9 + 1;
    } while (iVar9 != local_3c);
  }
  return;
}

Assistant:

static void stbtt__h_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes, unsigned int kernel_width)
{
unsigned char buffer[STBTT_MAX_OVERSAMPLE];
int safe_w = w - kernel_width;
int j;
STBTT_memset(buffer, 0, STBTT_MAX_OVERSAMPLE); /*  suppress bogus warning from VS2013 -analyze */
for (j=0; j < h; ++j) {
int i;
unsigned int total;
STBTT_memset(buffer, 0, kernel_width);

total = 0;

/*  make kernel_width a constant in common cases so compiler can optimize out the divide */
switch (kernel_width) {
case 2:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 2);
}
break;
case 3:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 3);
}
break;
case 4:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 4);
}
break;
case 5:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 5);
}
break;
default:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / kernel_width);
}
break;
}

for (; i < w; ++i) {
STBTT_assert(pixels[i] == 0);
total -= buffer[i & STBTT__OVER_MASK];
pixels[i] = (unsigned char) (total / kernel_width);
}

pixels += stride_in_bytes;
}
}